

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

bool duckdb::
     ExtractFunctionData<duckdb::AggregateFunctionCatalogEntry,duckdb::AggregateFunctionExtractor>
               (FunctionEntry *entry,idx_t function_idx,DataChunk *output,idx_t output_offset)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  DataChunk *pDVar5;
  __type _Var6;
  idx_t iVar7;
  reference pvVar8;
  string *psVar9;
  long lVar10;
  vector<duckdb::Value,_true> *pvVar11;
  reference __args;
  ulong __val;
  Value local_2d0;
  DataChunk *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  vector<duckdb::Value,_true> parameter_names;
  AggregateFunctionCatalogEntry *function;
  optional_idx description_idx;
  string local_230;
  vector<duckdb::Value,_true> local_210;
  vector<duckdb::Value,_true> local_1f8;
  LogicalType local_1e0;
  LogicalType local_1c8;
  vector<duckdb::LogicalType,_true> parameter_types_vector;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  undefined1 local_f8 [48];
  _Alloc_hider local_c8;
  size_type sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  vStack_90;
  Value parameter_types_value;
  
  AggregateFunctionExtractor::GetParameterLogicalTypes
            (&parameter_types_vector,(AggregateFunctionCatalogEntry *)entry,function_idx);
  AggregateFunctionExtractor::GetParameterTypes
            (&parameter_types_value,(AggregateFunctionCatalogEntry *)entry,function_idx);
  description_idx = GetFunctionDescriptionIndex(&entry->descriptions,&parameter_types_vector);
  if (description_idx.index == 0xffffffffffffffff) {
    local_c8._M_p = (pointer)&local_b8;
    sStack_c0 = 0;
    local_b8._8_8_ = 0;
    local_f8._32_8_ = (pointer)0x0;
    local_f8._40_8_ = (pointer)0x0;
    local_f8._16_8_ = (pointer)0x0;
    local_f8._24_8_ = (pointer)0x0;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_b8._M_allocated_capacity = 0;
    local_a8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_90.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_90.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_90.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar7 = optional_idx::GetIndex(&description_idx);
    pvVar8 = vector<duckdb::FunctionDescription,_true>::get<true>(&entry->descriptions,iVar7);
    FunctionDescription::FunctionDescription((FunctionDescription *)local_f8,pvVar8);
  }
  psVar9 = Catalog::GetName_abi_cxx11_
                     ((((entry->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
  ::std::__cxx11::string::string((string *)&local_118,(string *)psVar9);
  Value::Value(&local_2d0,&local_118);
  DataChunk::SetValue(output,0,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  ::std::__cxx11::string::~string((string *)&local_118);
  iVar7 = Catalog::GetOid((((entry->super_StandardEntry).schema)->super_InCatalogEntry).catalog);
  lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar7);
  Value::BIGINT(&local_2d0,lVar10);
  DataChunk::SetValue(output,1,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  ::std::__cxx11::string::string
            ((string *)&local_138,
             (string *)
             &(((entry->super_StandardEntry).schema)->super_InCatalogEntry).super_CatalogEntry.name)
  ;
  Value::Value(&local_2d0,&local_138);
  DataChunk::SetValue(output,2,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  ::std::__cxx11::string::~string((string *)&local_138);
  psVar9 = &(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name;
  ::std::__cxx11::string::string((string *)&local_158,(string *)psVar9);
  Value::Value(&local_2d0,&local_158);
  DataChunk::SetValue(output,3,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  ::std::__cxx11::string::~string((string *)&local_158);
  local_290 = output;
  if ((entry->alias_of)._M_string_length != 0) {
    _Var6 = ::std::operator==(&entry->alias_of,psVar9);
    if (!_Var6) {
      ::std::__cxx11::string::string((string *)&local_178,(string *)&entry->alias_of);
      Value::Value(&local_2d0,&local_178);
      bVar3 = true;
      bVar4 = false;
      goto LAB_01891fc2;
    }
  }
  LogicalType::LogicalType(&local_1c8,SQLNULL);
  Value::Value(&local_2d0,&local_1c8);
  bVar4 = true;
  bVar3 = false;
LAB_01891fc2:
  DataChunk::SetValue(local_290,4,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  if (bVar3) {
    ::std::__cxx11::string::~string((string *)&local_178);
  }
  if (bVar4) {
    LogicalType::~LogicalType(&local_1c8);
  }
  AggregateFunctionExtractor::GetFunctionType();
  pDVar5 = local_290;
  DataChunk::SetValue(local_290,5,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  sVar1 = sStack_c0;
  if (sStack_c0 == 0) {
    LogicalType::LogicalType(&local_1e0,SQLNULL);
    Value::Value(&local_2d0,&local_1e0);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_198,(string *)&local_c8);
    Value::Value(&local_2d0,&local_198);
  }
  DataChunk::SetValue(pDVar5,6,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  if (sVar1 == 0) {
    LogicalType::~LogicalType(&local_1e0);
  }
  else {
    ::std::__cxx11::string::~string((string *)&local_198);
  }
  DataChunk::SetValue(pDVar5,7,output_offset,
                      &(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment)
  ;
  Value::MAP(&local_2d0,&(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.tags);
  DataChunk::SetValue(pDVar5,8,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  AggregateFunctionExtractor::GetReturnType
            (&local_2d0,(AggregateFunctionCatalogEntry *)entry,function_idx);
  DataChunk::SetValue(pDVar5,9,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  parameter_names.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  parameter_names.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  parameter_names.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (local_f8._24_8_ == local_f8._32_8_) {
    AggregateFunctionExtractor::GetParameters
              ((vector<duckdb::Value,_true> *)&local_288,(AggregateFunctionCatalogEntry *)entry,
               function_idx);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::_M_move_assign
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&parameter_names,&local_288)
    ;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_288);
  }
  else {
    __val = 0;
    while( true ) {
      pvVar11 = ListValue::GetChildren(&parameter_types_value);
      if ((ulong)((long)(pvVar11->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar11->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6) <= __val) break;
      if (__val < (ulong)((long)(local_f8._32_8_ - local_f8._24_8_) >> 5)) {
        __args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)(local_f8 + 0x18),__val);
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&parameter_names,__args);
      }
      else {
        ::std::__cxx11::to_string(&local_230,__val);
        ::std::operator+(&local_288,"col",&local_230);
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&parameter_names,
                   &local_288);
        ::std::__cxx11::string::~string((string *)&local_288);
        ::std::__cxx11::string::~string((string *)&local_230);
      }
      __val = __val + 1;
    }
  }
  LogicalType::LogicalType((LogicalType *)&local_288,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_230,
             &parameter_names.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  pDVar5 = local_290;
  Value::LIST(&local_2d0,(LogicalType *)&local_288,(vector<duckdb::Value,_true> *)&local_230);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_230);
  LogicalType::~LogicalType((LogicalType *)&local_288);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&parameter_names);
  DataChunk::SetValue(pDVar5,10,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  DataChunk::SetValue(pDVar5,0xb,output_offset,&parameter_types_value);
  AggregateFunctionExtractor::GetVarArgs
            (&local_2d0,(AggregateFunctionCatalogEntry *)entry,function_idx);
  DataChunk::SetValue(pDVar5,0xc,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  AggregateFunctionExtractor::GetMacroDefinition
            (&local_2d0,(AggregateFunctionCatalogEntry *)entry,function_idx);
  DataChunk::SetValue(pDVar5,0xd,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  AggregateFunctionExtractor::IsVolatile
            (&local_2d0,(AggregateFunctionCatalogEntry *)entry,function_idx);
  DataChunk::SetValue(pDVar5,0xe,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  Value::BOOLEAN(&local_2d0,
                 (entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal);
  DataChunk::SetValue(pDVar5,0xf,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                     ((entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid);
  Value::BIGINT(&local_2d0,lVar10);
  DataChunk::SetValue(pDVar5,0x10,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  LogicalType::LogicalType((LogicalType *)&local_288,VARCHAR);
  ToValueVector(&local_1f8,&local_a8);
  Value::LIST(&local_2d0,(LogicalType *)&local_288,&local_1f8);
  DataChunk::SetValue(pDVar5,0x11,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1f8);
  LogicalType::~LogicalType((LogicalType *)&local_288);
  AggregateFunctionExtractor::ResultType
            (&local_2d0,(AggregateFunctionCatalogEntry *)entry,function_idx);
  DataChunk::SetValue(pDVar5,0x12,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  LogicalType::LogicalType((LogicalType *)&local_288,VARCHAR);
  ToValueVector(&local_210,&vStack_90);
  Value::LIST(&local_2d0,(LogicalType *)&local_288,&local_210);
  DataChunk::SetValue(pDVar5,0x13,output_offset,&local_2d0);
  Value::~Value(&local_2d0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_210);
  LogicalType::~LogicalType((LogicalType *)&local_288);
  sVar1 = entry[1].super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.name._M_string_length
  ;
  pcVar2 = entry[1].super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.name._M_dataplus.
           _M_p;
  FunctionDescription::~FunctionDescription((FunctionDescription *)local_f8);
  Value::~Value(&parameter_types_value);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&parameter_types_vector.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return function_idx + 1 == (long)(sVar1 - (long)pcVar2) / 0x130;
}

Assistant:

bool ExtractFunctionData(FunctionEntry &entry, idx_t function_idx, DataChunk &output, idx_t output_offset) {
	auto &function = entry.Cast<T>();
	vector<LogicalType> parameter_types_vector = OP::GetParameterLogicalTypes(function, function_idx);
	Value parameter_types_value = OP::GetParameterTypes(function, function_idx);
	optional_idx description_idx = GetFunctionDescriptionIndex(entry.descriptions, parameter_types_vector);
	FunctionDescription function_description =
	    description_idx.IsValid() ? entry.descriptions[description_idx.GetIndex()] : FunctionDescription();

	idx_t col = 0;

	// database_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.schema.catalog.GetName()));

	// database_oid, BIGINT
	output.SetValue(col++, output_offset, Value::BIGINT(NumericCast<int64_t>(function.schema.catalog.GetOid())));

	// schema_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.schema.name));

	// function_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.name));

	// alias_of, LogicalType::VARCHAR
	output.SetValue(col++, output_offset,
	                function.alias_of.empty() || function.alias_of == function.name ? Value()
	                                                                                : Value(function.alias_of));

	// function_type, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(OP::GetFunctionType()));

	// function_description, LogicalType::VARCHAR
	output.SetValue(col++, output_offset,
	                (function_description.description.empty()) ? Value() : Value(function_description.description));

	// comment, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, entry.comment);

	// tags, LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR)
	output.SetValue(col++, output_offset, Value::MAP(entry.tags));

	// return_type, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetReturnType(function, function_idx));

	// parameters, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                GetParameterNames<T, OP>(function, function_idx, function_description, parameter_types_value));

	// parameter_types, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset, parameter_types_value);

	// varargs, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetVarArgs(function, function_idx));

	// macro_definition, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetMacroDefinition(function, function_idx));

	// has_side_effects, LogicalType::BOOLEAN
	output.SetValue(col++, output_offset, OP::IsVolatile(function, function_idx));

	// internal, LogicalType::BOOLEAN
	output.SetValue(col++, output_offset, Value::BOOLEAN(function.internal));

	// function_oid, LogicalType::BIGINT
	output.SetValue(col++, output_offset, Value::BIGINT(NumericCast<int64_t>(function.oid)));

	// examples, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                Value::LIST(LogicalType::VARCHAR, ToValueVector(function_description.examples)));

	// stability, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::ResultType(function, function_idx));

	// categories, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                Value::LIST(LogicalType::VARCHAR, ToValueVector(function_description.categories)));

	return function_idx + 1 == OP::FunctionCount(function);
}